

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O3

void jpc_mqenc_setctxs(jpc_mqenc_t *mqenc,int numctxs,jpc_mqctx_t *ctxs)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  jpc_mqstate_t **ppjVar4;
  ulong uVar5;
  int_fast16_t *piVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  ppjVar4 = mqenc->ctxs;
  iVar1 = mqenc->maxctxs;
  iVar7 = numctxs;
  if (iVar1 < numctxs) {
    iVar7 = iVar1;
  }
  if (0 < iVar7) {
    uVar8 = iVar7 + 1;
    piVar6 = &ctxs->ind;
    do {
      *ppjVar4 = (jpc_mqstate_t *)
                 ((long)&jpc_mqstates[0].qeval +
                 ((ulong)((jpc_mqctx_t *)(piVar6 + -1))->mps << 5 | *piVar6 << 6));
      ppjVar4 = ppjVar4 + 1;
      uVar8 = uVar8 - 1;
      piVar6 = piVar6 + 2;
    } while (1 < uVar8);
  }
  auVar3 = _DAT_00139d70;
  auVar2 = _DAT_001384e0;
  if (numctxs < iVar1) {
    uVar8 = iVar1 + ~numctxs;
    auVar9._4_4_ = 0;
    auVar9._0_4_ = uVar8;
    auVar9._8_4_ = uVar8;
    auVar9._12_4_ = 0;
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_001384e0;
    do {
      auVar10._8_4_ = (int)uVar5;
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = (int)(uVar5 >> 0x20);
      auVar10 = (auVar10 | auVar3) ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        ppjVar4[uVar5] = jpc_mqstates;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        ppjVar4[uVar5 + 1] = jpc_mqstates;
      }
      uVar5 = uVar5 + 2;
    } while (((ulong)uVar8 + 2 & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

void jpc_mqenc_setctxs(jpc_mqenc_t *mqenc, int numctxs, const jpc_mqctx_t *ctxs)
{
	const jpc_mqstate_t **ctx;
	int n;

	ctx = mqenc->ctxs;
	n = JAS_MIN(mqenc->maxctxs, numctxs);
	while (--n >= 0) {
		*ctx = &jpc_mqstates[2 * ctxs->ind + ctxs->mps];
		++ctx;
		++ctxs;
	}
	n = mqenc->maxctxs - numctxs;
	while (--n >= 0) {
		*ctx = &jpc_mqstates[0];
		++ctx;
	}

}